

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

void anon_unknown.dwarf_54919::InitVoice
               (Voice *voice,ALsource *source,BufferlistItem *BufferList,ALCcontext *context,
               ALCdevice *device)

{
  vector<ChannelData> *this;
  FmtChannels FVar1;
  ALuint in_order;
  BufferStorage *pBVar2;
  pointer pCVar3;
  ALsource *pAVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BufferlistItem *pBVar8;
  EVP_PKEY_CTX *pEVar9;
  array<SendParams,_6UL> *paVar10;
  long lVar11;
  ChannelData *chandata;
  size_type __n;
  EVP_PKEY_CTX *ctx;
  anon_struct_128_2_952b89bb_for_Gains *paVar12;
  pointer pCVar13;
  array<unsigned_char,_7UL> *paVar14;
  byte bVar15;
  BandSplitter splitter;
  array<float,_4UL> scales;
  BandSplitterR<float> local_108;
  _Type local_f8;
  ALCcontext *local_e8;
  ALsource *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar15 = 0;
  if (source->Looping == true) {
    pBVar8 = source->queue;
  }
  else {
    pBVar8 = (BufferlistItem *)0x0;
  }
  (voice->mLoopBuffer)._M_b._M_p = pBVar8;
  pBVar2 = BufferList->mBuffer;
  local_e8 = context;
  uVar5 = ChannelsFromFmt(pBVar2->mChannels,pBVar2->mAmbiOrder);
  voice->mFrequency = pBVar2->mSampleRate;
  voice->mFmtChannels = pBVar2->mChannels;
  uVar6 = BytesFromFmt(pBVar2->mType);
  voice->mSampleSize = uVar6;
  voice->mAmbiLayout = pBVar2->mAmbiLayout;
  voice->mAmbiScaling = pBVar2->mAmbiScaling;
  voice->mAmbiOrder = pBVar2->mAmbiOrder;
  uVar7 = 2;
  if ((pBVar2->mCallback != (CallbackType)0x0) || (uVar7 = 1, source->SourceType == 0x1028)) {
    voice->mFlags = voice->mFlags | uVar7;
  }
  voice->mNumCallbackSamples = 0;
  voice->mStep = 0;
  this = &voice->mChans;
  pCVar13 = (voice->mChans).
            super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl
            .super__Vector_impl_data._M_start;
  pEVar9 = (EVP_PKEY_CTX *)
           (((long)(voice->mChans).
                   super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar13 >> 5) *
           0x1cac083126e978d5);
  ctx = (EVP_PKEY_CTX *)(ulong)uVar5;
  local_e0 = source;
  if (((EVP_PKEY_CTX *)&DAT_00000002 < pEVar9) && (ctx <= pEVar9 && (long)pEVar9 - (long)ctx != 0))
  {
    (this->super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (voice->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (voice->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pCVar13 != (pointer)0x0) {
      al_free(pCVar13);
    }
  }
  __n = 2;
  if (2 < uVar5) {
    __n = (size_type)uVar5;
  }
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::reserve(this,__n);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::resize
            (this,(size_type)ctx);
  in_order = voice->mAmbiOrder;
  if (in_order != 0) {
    uVar7 = device->mAmbiOrder;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar7;
    if (in_order < uVar7) {
      FVar1 = voice->mFmtChannels;
      local_f8 = (_Type)BFormatDec::GetHFOrderScales(in_order,uVar7);
      local_108.mCoeff = 0.0;
      local_108.mLpZ1 = 0.0;
      local_108.mLpZ2 = 0.0;
      local_108.mApZ1 = 0.0;
      BandSplitterR<float>::init(&local_108,ctx);
      pCVar13 = (voice->mChans).
                super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar3 = (voice->mChans).
               super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar13 != pCVar3) {
        if (FVar1 == FmtBFormat2D) {
          paVar14 = &AmbiIndex::OrderFrom2DChannel;
        }
        else {
          paVar14 = (array<unsigned_char,_7UL> *)&AmbiIndex::OrderFromChannel;
        }
        do {
          memset(pCVar13,0,0xc0);
          pCVar13->mAmbiScale = local_f8[paVar14->_M_elems[0]];
          (pCVar13->mAmbiSplitter).mCoeff = local_108.mCoeff;
          (pCVar13->mAmbiSplitter).mLpZ1 = local_108.mLpZ1;
          (pCVar13->mAmbiSplitter).mLpZ2 = local_108.mLpZ2;
          (pCVar13->mAmbiSplitter).mApZ1 = local_108.mApZ1;
          (pCVar13->mDryParams).LowPass.mZ1 = 0.0;
          (pCVar13->mDryParams).LowPass.mZ2 = 0.0;
          (pCVar13->mDryParams).LowPass.mB0 = 1.0;
          (pCVar13->mDryParams).HighPass.mZ1 = 0.0;
          (pCVar13->mDryParams).HighPass.mZ2 = 0.0;
          (pCVar13->mDryParams).LowPass.mB1 = 0.0;
          (pCVar13->mDryParams).LowPass.mB2 = 0.0;
          (pCVar13->mDryParams).LowPass.mA1 = 0.0;
          (pCVar13->mDryParams).LowPass.mA2 = 0.0;
          (pCVar13->mDryParams).HighPass.mB0 = 1.0;
          ctx = (EVP_PKEY_CTX *)0x0;
          memset(&(pCVar13->mDryParams).HighPass.mB1,0,0xa48);
          uVar7 = device->NumAuxSends;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          local_c8 = 0;
          uStack_c0 = 0;
          local_b8 = 0;
          uStack_b0 = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_88 = 0;
          uStack_80 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_68 = 0;
          uStack_60 = 0;
          if ((ulong)uVar7 != 0) {
            paVar10 = &pCVar13->mWetParams;
            do {
              paVar10->_M_elems[0].LowPass.mZ1 = 0.0;
              paVar10->_M_elems[0].LowPass.mZ2 = 0.0;
              paVar10->_M_elems[0].LowPass.mB0 = 1.0;
              paVar10->_M_elems[0].LowPass.mB1 = 0.0;
              paVar10->_M_elems[0].LowPass.mB2 = 0.0;
              paVar10->_M_elems[0].LowPass.mA1 = 0.0;
              paVar10->_M_elems[0].LowPass.mA2 = 0.0;
              paVar10->_M_elems[0].HighPass.mZ1 = 0.0;
              paVar10->_M_elems[0].HighPass.mZ2 = 0.0;
              paVar10->_M_elems[0].HighPass.mB0 = 1.0;
              paVar10->_M_elems[0].HighPass.mB1 = 0.0;
              paVar10->_M_elems[0].HighPass.mB2 = 0.0;
              paVar10->_M_elems[0].HighPass.mA1 = 0.0;
              paVar10->_M_elems[0].HighPass.mA2 = 0.0;
              ctx = (EVP_PKEY_CTX *)&local_d8;
              paVar12 = &paVar10->_M_elems[0].Gains;
              for (lVar11 = 0x20; lVar11 != 0; lVar11 = lVar11 + -1) {
                (paVar12->Current)._M_elems[0] = *(float *)ctx;
                ctx = ctx + (ulong)bVar15 * -8 + 4;
                paVar12 = (anon_struct_128_2_952b89bb_for_Gains *)
                          ((long)paVar12 + (ulong)bVar15 * -8 + 4);
              }
              paVar10 = (array<SendParams,_6UL> *)(paVar10->_M_elems + 1);
            } while ((SendParams *)paVar10 != (pCVar13->mWetParams)._M_elems + uVar7);
          }
          paVar14 = (array<unsigned_char,_7UL> *)((long)paVar14 + 1);
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar3);
      }
      *(byte *)&voice->mFlags = (byte)voice->mFlags | 4;
      goto LAB_00128382;
    }
  }
  pCVar13 = (voice->mChans).
            super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl
            .super__Vector_impl_data._M_start;
  pCVar3 = (voice->mChans).
           super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar13 != pCVar3) {
    do {
      memset(pCVar13,0,0xc0);
      (pCVar13->mDryParams).LowPass.mZ1 = 0.0;
      (pCVar13->mDryParams).LowPass.mZ2 = 0.0;
      (pCVar13->mDryParams).LowPass.mB0 = 1.0;
      (pCVar13->mDryParams).LowPass.mB1 = 0.0;
      (pCVar13->mDryParams).LowPass.mB2 = 0.0;
      (pCVar13->mDryParams).LowPass.mA1 = 0.0;
      (pCVar13->mDryParams).LowPass.mA2 = 0.0;
      (pCVar13->mDryParams).HighPass.mZ1 = 0.0;
      (pCVar13->mDryParams).HighPass.mZ2 = 0.0;
      (pCVar13->mDryParams).HighPass.mB0 = 1.0;
      ctx = (EVP_PKEY_CTX *)0x0;
      memset(&(pCVar13->mDryParams).HighPass.mB1,0,0xa48);
      uVar7 = device->NumAuxSends;
      local_f8 = (_Type)ZEXT816(0);
      local_108.mCoeff = 0.0;
      local_108.mLpZ1 = 0.0;
      local_108.mLpZ2 = 0.0;
      local_108.mApZ1 = 0.0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      if ((ulong)uVar7 != 0) {
        paVar10 = &pCVar13->mWetParams;
        do {
          paVar10->_M_elems[0].LowPass.mZ1 = 0.0;
          paVar10->_M_elems[0].LowPass.mZ2 = 0.0;
          paVar10->_M_elems[0].LowPass.mB0 = 1.0;
          paVar10->_M_elems[0].LowPass.mB1 = 0.0;
          paVar10->_M_elems[0].LowPass.mB2 = 0.0;
          paVar10->_M_elems[0].LowPass.mA1 = 0.0;
          paVar10->_M_elems[0].LowPass.mA2 = 0.0;
          paVar10->_M_elems[0].HighPass.mZ1 = 0.0;
          paVar10->_M_elems[0].HighPass.mZ2 = 0.0;
          paVar10->_M_elems[0].HighPass.mB0 = 1.0;
          paVar10->_M_elems[0].HighPass.mB1 = 0.0;
          paVar10->_M_elems[0].HighPass.mB2 = 0.0;
          paVar10->_M_elems[0].HighPass.mA1 = 0.0;
          paVar10->_M_elems[0].HighPass.mA2 = 0.0;
          ctx = (EVP_PKEY_CTX *)&local_d8;
          paVar12 = &paVar10->_M_elems[0].Gains;
          for (lVar11 = 0x20; lVar11 != 0; lVar11 = lVar11 + -1) {
            (paVar12->Current)._M_elems[0] = *(float *)ctx;
            ctx = ctx + (ulong)bVar15 * -8 + 4;
            paVar12 = (anon_struct_128_2_952b89bb_for_Gains *)
                      ((long)paVar12 + (ulong)bVar15 * -8 + 4);
          }
          paVar10 = (array<SendParams,_6UL> *)(paVar10->_M_elems + 1);
        } while ((SendParams *)paVar10 != (pCVar13->mWetParams)._M_elems + uVar7);
      }
      pCVar13 = pCVar13 + 1;
    } while (pCVar13 != pCVar3);
  }
LAB_00128382:
  if (0.0 < device->AvgSpeakerDist) {
    pCVar3 = (voice->mChans).
             super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pCVar13 = (voice->mChans).
                   super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar3;
        pCVar13 = pCVar13 + 1) {
      NfcFilter::init(&(pCVar13->mDryParams).NFCtrlFilter,ctx);
    }
  }
  pAVar4 = local_e0;
  LOCK();
  (local_e0->PropsClean).super___atomic_flag_base._M_i = true;
  UNLOCK();
  UpdateSourceProps(local_e0,voice,local_e8);
  (voice->mSourceID).super___atomic_base<unsigned_int>._M_i = pAVar4->id;
  return;
}

Assistant:

void InitVoice(Voice *voice, ALsource *source, BufferlistItem *BufferList, ALCcontext *context,
    ALCdevice *device)
{
    voice->mLoopBuffer.store(source->Looping ? source->queue : nullptr, std::memory_order_relaxed);

    BufferStorage *buffer{BufferList->mBuffer};
    ALuint num_channels{buffer->channelsFromFmt()};
    voice->mFrequency = buffer->mSampleRate;
    voice->mFmtChannels = buffer->mChannels;
    voice->mSampleSize  = buffer->bytesFromFmt();
    voice->mAmbiLayout = buffer->mAmbiLayout;
    voice->mAmbiScaling = buffer->mAmbiScaling;
    voice->mAmbiOrder = buffer->mAmbiOrder;

    if(buffer->mCallback) voice->mFlags |= VoiceIsCallback;
    else if(source->SourceType == AL_STATIC) voice->mFlags |= VoiceIsStatic;
    voice->mNumCallbackSamples = 0;

    /* Clear the stepping value explicitly so the mixer knows not to mix this
     * until the update gets applied.
     */
    voice->mStep = 0;

    if(voice->mChans.capacity() > 2 && num_channels < voice->mChans.capacity())
        al::vector<Voice::ChannelData>{}.swap(voice->mChans);
    voice->mChans.reserve(maxu(2, num_channels));
    voice->mChans.resize(num_channels);

    /* Don't need to set the VOICE_IS_AMBISONIC flag if the device is not
     * higher order than the voice. No HF scaling is necessary to mix it.
     */
    if(voice->mAmbiOrder && device->mAmbiOrder > voice->mAmbiOrder)
    {
        const uint8_t *OrderFromChan{(voice->mFmtChannels == FmtBFormat2D) ?
            AmbiIndex::OrderFrom2DChannel.data() :
            AmbiIndex::OrderFromChannel.data()};
        const auto scales = BFormatDec::GetHFOrderScales(voice->mAmbiOrder, device->mAmbiOrder);

        const BandSplitter splitter{400.0f / static_cast<float>(device->Frequency)};

        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mAmbiScale = scales[*(OrderFromChan++)];
            chandata.mAmbiSplitter = splitter;
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }

        voice->mFlags |= VoiceIsAmbisonic;
    }
    else
    {
        /* Clear previous samples. */
        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }
    }

    if(device->AvgSpeakerDist > 0.0f)
    {
        const float w1{SpeedOfSoundMetersPerSec /
            (device->AvgSpeakerDist * static_cast<float>(device->Frequency))};
        for(auto &chandata : voice->mChans)
            chandata.mDryParams.NFCtrlFilter.init(w1);
    }

    source->PropsClean.test_and_set(std::memory_order_acq_rel);
    UpdateSourceProps(source, voice, context);

    voice->mSourceID.store(source->id, std::memory_order_release);
}